

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_insertArray_success_zeroArraySize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 5;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x111115;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(array.buffer,"0156",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x11114a;
  bVar1 = private_ACUtils_ADynArray_insertArray(&array,2,"234",0,1);
  if (bVar1 == true) {
    uStack_50 = 0x111164;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x374);
    if (array.size == 5) {
      uStack_50 = 0x111184;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x375);
      if (array.capacity == 5) {
        uStack_50 = 0x1111a4;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x376);
        if (array.buffer == (char *)0x0) {
          ppcVar6 = &local_58;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x377;
LAB_0011140a:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) =
               test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_50 = 0x1111c1;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x377);
        pcStack_80 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar3 = "";
          pcStack_80 = "(null)";
        }
        else {
          uStack_50 = 0x1111de;
          iVar2 = strcmp("0156",array.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x1111f7;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x378);
            if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar6 = &local_58;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x379;
            }
            else {
              uStack_50 = 0x111214;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x379);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_50 = 0x111235;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x37a);
                uStack_50 = 0x11123e;
                (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
                return;
              }
              ppcVar6 = &local_68;
              local_60 = "0";
              local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x37a;
            }
            goto LAB_0011140a;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"0156\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x378;
        local_58 = "\"";
        local_60 = "0156";
        local_68 = "\"";
        pcStack_70 = "\"0156\"";
        ppcVar5 = &pcStack_80;
        pcStack_78 = pcVar3;
        goto LAB_0011138a;
      }
      pcVar4 = "array.capacity == 5";
      pcVar7 = "array.capacity";
      iVar2 = 0x376;
      pcVar3 = (char *)array.capacity;
    }
    else {
      pcVar4 = "array.size == 5";
      pcVar7 = "array.size";
      iVar2 = 0x375;
      pcVar3 = (char *)array.size;
    }
    local_60 = "5";
    local_58 = (char *)0x5;
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_insertArray(&array, 2, \"234\", 0, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, 2, \"234\", 0, sizeof(*(&array)->buffer))";
    iVar2 = 0x374;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_60;
LAB_0011138a:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x111391;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertArray_success_zeroArraySize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "0156", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(&array, 2, "234", 0), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0156");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}